

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void __thiscall Symbol::print(Symbol *this)

{
  pointer pSVar1;
  long lVar2;
  pointer pdVar3;
  pointer piVar4;
  ostream *poVar5;
  int i;
  long lVar6;
  long lVar7;
  int j;
  long lVar8;
  ostream *poVar9;
  long local_38;
  
  poVar9 = (ostream *)&std::cout;
  poVar5 = std::operator<<((ostream *)&std::cout,"Name: ");
  poVar5 = std::operator<<(poVar5,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar5);
  switch(this->type_) {
  case kFunction:
    poVar5 = (ostream *)&std::cout;
    poVar9 = std::operator<<((ostream *)&std::cout,"Method Args: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    local_38 = 0;
    lVar7 = local_38;
switchD_0013986b_default:
    local_38 = lVar7;
    if ((int)(((long)(this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)(this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x88) <= local_38) goto LAB_00139ac7;
    poVar9 = std::operator<<((ostream *)&std::cout,"    Arg ");
    lVar7 = local_38 + 1;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)lVar7);
    poVar9 = std::operator<<(poVar9,anon_var_dwarf_ae22 + 0xc);
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"        Name: ");
    poVar9 = std::operator<<(poVar9,(string *)
                                    ((this->value_).args.
                                     super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_38));
    std::endl<char,std::char_traits<char>>(poVar9);
    switch((this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
           super__Vector_impl_data._M_start[local_38].type_) {
    case kInt:
      poVar9 = std::operator<<((ostream *)&std::cout,"        Int Value: ");
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (poVar9,(this->value_).args.
                                 super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_38].value_.int_value);
      break;
    case kIntArray:
      std::operator<<((ostream *)&std::cout,"        Int Array: ");
      lVar8 = 0x14;
      for (lVar6 = 0;
          pSVar1 = (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                   super__Vector_impl_data._M_start,
          lVar2 = *(long *)((long)pSVar1 + lVar8 * 4 + -8),
          lVar6 < (int)((ulong)(*(long *)((long)&(pSVar1->name_)._M_dataplus + lVar8 * 4) - lVar2)
                       >> 2); lVar6 = lVar6 + 1) {
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(lVar2 + lVar6 * 4));
        std::operator<<(poVar9," ");
        lVar8 = lVar8 + 0x22;
      }
      goto LAB_0013996d;
    case kReal:
      std::operator<<((ostream *)&std::cout,"        Real Value: ");
      poVar9 = std::ostream::_M_insert<double>
                         ((this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_38].value_.real_value);
      break;
    case kRealArray:
      std::operator<<((ostream *)&std::cout,"        Real Array: ");
      lVar8 = 0x70;
      lVar6 = 0;
      while (pSVar1 = (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                      _M_impl.super__Vector_impl_data._M_start,
            lVar2 = *(long *)((long)pSVar1 + lVar8 + -8),
            local_38 <
            (int)((ulong)(*(long *)((long)&(pSVar1->name_)._M_dataplus + lVar8) - lVar2) >> 3)) {
        poVar9 = std::ostream::_M_insert<double>(*(double *)(lVar2 + lVar6));
        std::operator<<(poVar9," ");
        lVar6 = lVar6 + 8;
        lVar8 = lVar8 + 0x88;
      }
LAB_0013996d:
      poVar9 = (ostream *)&std::cout;
      break;
    default:
      goto switchD_0013986b_default;
    }
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"        Is Assigned: ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    std::endl<char,std::char_traits<char>>(poVar9);
    goto switchD_0013986b_default;
  case kInt:
    poVar5 = std::operator<<((ostream *)&std::cout,"Int Value: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar5,(this->value_).int_value);
    break;
  case kIntArray:
    poVar9 = (ostream *)&std::cout;
    std::operator<<((ostream *)&std::cout,"Int Array: ");
    for (lVar7 = 0;
        piVar4 = (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar7 < (int)((ulong)((long)(this->value_).int_array.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar4) >> 2);
        lVar7 = lVar7 + 1) {
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,piVar4[lVar7]);
      std::operator<<(poVar5," ");
    }
    break;
  case kReal:
    std::operator<<((ostream *)&std::cout,"Real Value: ");
    poVar9 = std::ostream::_M_insert<double>((this->value_).real_value);
    break;
  case kRealArray:
    std::operator<<((ostream *)&std::cout,"Real Array: ");
    for (lVar7 = 0;
        pdVar3 = (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        lVar7 < (int)((ulong)((long)(this->value_).real_array.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
        lVar7 = lVar7 + 1) {
      poVar5 = std::ostream::_M_insert<double>(pdVar3[lVar7]);
      std::operator<<(poVar5," ");
    }
    break;
  default:
    goto switchD_0013978a_default;
  }
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar5 = std::operator<<((ostream *)&std::cout,"Is Assigned: ");
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
LAB_00139ac7:
  std::endl<char,std::char_traits<char>>(poVar5);
switchD_0013978a_default:
  poVar5 = std::operator<<((ostream *)&std::cout,"===================================");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void Symbol::print() const {
    std::cout << "Name: " << name_ << std::endl;
    if (type_ == Symbol::Type::kInt) {
        std::cout << "Int Value: " << value_.int_value << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kIntArray) {
        std::cout << "Int Array: ";
        for (int i = 0; i < (int)value_.int_array.size(); i++) {
            std::cout << value_.int_array[i] << " ";
        }
        std::cout << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kReal) {
        std::cout << "Real Value: " << value_.real_value << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kRealArray) {
        std::cout << "Real Array: ";
        for (int i = 0; i < (int)value_.real_array.size(); i++) {
            std::cout << value_.real_array[i] << " ";
        }
        std::cout << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kFunction) {
        std::cout << "Method Args: " << std::endl;
        for (int i = 0; i < (int)value_.args.size(); i++) {
            std::cout << "    Arg " << i + 1 << ":" << std::endl;
            std::cout << "        Name: " << value_.args[i].name_ << std::endl;
            if (value_.args[i].type_ == Symbol::Type::kInt) {
                std::cout << "        Int Value: " << value_.args[i].value_.int_value << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kIntArray) {
                std::cout << "        Int Array: ";
                for (int j = 0; j < (int)value_.args[j].value_.int_array.size(); j++) {
                    std::cout << value_.args[j].value_.int_array[j] << " ";
                }
                std::cout << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kReal) {
                std::cout << "        Real Value: " << value_.args[i].value_.real_value << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kRealArray) {
                std::cout << "        Real Array: ";
                for (int j = 0; i < (int) value_.args[j].value_.real_array.size(); j++) {
                    std::cout << value_.args[j].value_.real_array[j] << " ";
                }
                std::cout << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            }
        }
        std::cout << std::endl;
    }
    std::cout << "===================================" << std::endl;
}